

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::vector<unsigned_char>::assign(vector<unsigned_char> *this,vector<unsigned_char> *other)

{
  bool bVar1;
  vector<unsigned_char> *in_RSI;
  vector<unsigned_char> *in_RDI;
  
  if (in_RDI != in_RSI) {
    if (in_RDI->m_capacity == in_RSI->m_size) {
      resize(in_RSI,(uint32)((ulong)in_RDI >> 0x20));
    }
    else {
      clear(in_RDI);
      bVar1 = increase_capacity(in_RSI,(uint32)((ulong)in_RDI >> 0x20),
                                SUB81((ulong)in_RDI >> 0x18,0));
      if (!bVar1) {
        return false;
      }
    }
    memcpy(in_RDI->m_p,in_RSI->m_p,(ulong)in_RSI->m_size);
    in_RDI->m_size = in_RSI->m_size;
  }
  return true;
}

Assistant:

inline bool assign(const vector& other) {
    if (this == &other)
      return true;

    if (m_capacity == other.m_size)
      resize(0);
    else {
      clear();

      if (!increase_capacity(other.m_size, false))
        return false;
    }

    if (scalar_type<T>::cFlag)
      memcpy(m_p, other.m_p, other.m_size * sizeof(T));
    else {
      T* pDst = m_p;
      const T* pSrc = other.m_p;
      for (uint32 i = other.m_size; i > 0; i--)
        helpers::construct(pDst++, *pSrc++);
    }

    m_size = other.m_size;

    return true;
  }